

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

void option::PrintUsageImplementation::indent(IStringWriter *write,int *x,int want_x)

{
  int iVar1;
  char space;
  undefined1 local_29;
  
  iVar1 = want_x - *x;
  if (want_x - *x < 0) {
    (**write->_vptr_IStringWriter)(write,"\n",1);
    iVar1 = want_x;
  }
  if (0 < iVar1) {
    local_29 = 0x20;
    do {
      (**write->_vptr_IStringWriter)(write,&local_29,1);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    *x = want_x;
  }
  return;
}

Assistant:

static void indent(IStringWriter& write, int& x, int want_x)
  {
    int indent = want_x - x;
    if (indent < 0)
    {
      write("\n", 1);
      indent = want_x;
    }

    if (indent > 0)
    {
      char space = ' ';
      for (int i = 0; i < indent; ++i)
        write(&space, 1);
      x = want_x;
    }
  }